

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gabby.cc
# Opt level: O0

int main(int argc,char **argv)

{
  u8 *__x;
  size_type sVar1;
  ulong uVar2;
  f64 fVar3;
  f64 fVar4;
  Error *e;
  f64 gb_time;
  f64 host_time;
  Clock i_1;
  Clock i;
  f64 start_time;
  Clock run_clocks;
  undefined1 auStack_19d58 [8];
  GB gb;
  undefined1 local_40 [8];
  Buffer boot_rom_file;
  char **argv_local;
  int argc_local;
  
  ParseArguments(argc,argv);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_40);
  if (s_boot_rom_filename != (char *)0x0) {
    ReadFile((Buffer *)(gb.s.io + 0xf8),s_boot_rom_filename);
    __x = gb.s.io + 0xf8;
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator=
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_40,
               (vector<unsigned_char,_std::allocator<unsigned_char>_> *)__x);
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)__x);
    sVar1 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size
                      ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_40);
    ThrowUnless(sVar1 == 0x100,"Invalid boot rom size");
  }
  ReadFile((Buffer *)&run_clocks,s_filename);
  GB::GB((GB *)auStack_19d58,(Buffer *)&run_clocks,(Buffer *)local_40,Guess);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&run_clocks);
  uVar2 = (ulong)(uint)(s_frames * 0x11250);
  fVar3 = GetTime();
  if ((s_trace & 1U) == 0) {
    for (host_time = 0.0; (long)host_time < (long)uVar2; host_time = (f64)((long)host_time + 1)) {
      GB::Step((GB *)auStack_19d58);
    }
  }
  else {
    for (i_1 = 0; i_1 < (long)uVar2; i_1 = i_1 + 1) {
      GB::Trace((GB *)auStack_19d58);
      GB::Step((GB *)auStack_19d58);
    }
  }
  fVar4 = GetTime();
  printf("time: gb=%.1fs host=%.1fs (%.1fx)\n",(double)uVar2 * 2.384185791015625e-07,
         (double)fVar4 - (double)fVar3,
         ((double)uVar2 * 2.384185791015625e-07) / ((double)fVar4 - (double)fVar3));
  if (s_ppm_filename != (char *)0x0) {
    WriteFramePPM((GB *)auStack_19d58,s_ppm_filename);
  }
  GB::~GB((GB *)auStack_19d58);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_40);
  return 0;
}

Assistant:

int main(int argc, char** argv) {
  try {
    ParseArguments(argc, argv);

    Buffer boot_rom_file;
    if (s_boot_rom_filename) {
      boot_rom_file = ReadFile(s_boot_rom_filename);
      ThrowUnless(boot_rom_file.size() == 256, "Invalid boot rom size");
    }

    GB gb(ReadFile(s_filename), std::move(boot_rom_file), Variant::Guess);

    Clock run_clocks = s_frames * 70224u;
    f64 start_time = GetTime();
    if (s_trace) {
      for (Clock i = 0; i < run_clocks; ++i) {
        gb.Trace();
        gb.Step();
      }
    } else {
      for (Clock i = 0; i < run_clocks; ++i) {
        gb.Step();
#if 0
        if (gb.s.pc == 0x100 && gb.s.op_tick == 2) {
          printf("io: {\n  ");
          for (int i = 0; i < 0x4c; ++i) {
            printf("0x%02x,", gb.s.io[i]);
            if (((i+1) & 7) == 0) {
              printf("\n  ");
            }
          }
          printf("\n}\n");
          printf("af=0x%02x\n", gb.s.af);
          printf("bc=0x%02x\n", gb.s.bc);
          printf("de=0x%02x\n", gb.s.de);
          printf("hl=0x%02x\n", gb.s.hl);
          printf("sp=0x%02x\n", gb.s.sp);
          printf("pc=0x%02x\n", gb.s.pc);
          printf("ppu_mode = %d\n", gb.s.ppu_mode);
          printf("ppu_line_y = %d\n", gb.s.ppu_line_y);
          printf("tick = %lu\n", gb.s.tick);
          printf("ppu_lcd_on_tick = %ld\n", gb.s.ppu_lcd_on_tick);
          printf("ppu_line_start_tick = %ld\n", gb.s.ppu_line_start_tick);
          printf("ppu_mode_start_tick = %ld\n", gb.s.ppu_mode_start_tick);
          printf("div_reset_tick = %ld\n", gb.s.div_reset_tick);
        }
#endif
      }
    }
    f64 host_time = GetTime() - start_time;
    f64 gb_time = (f64)run_clocks / CpuClocksPerSec;
    printf("time: gb=%.1fs host=%.1fs (%.1fx)\n", gb_time, host_time,
           gb_time / host_time);

    if (s_ppm_filename) {
      WriteFramePPM(gb, s_ppm_filename);
    }

    return 0;
  } catch (const Error& e) {
    std::cerr << e.what() << "\n";
    return 1;
  }
}